

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2s-ref.c
# Opt level: O0

void blake2s_compress(blake2s_state *S,uint8_t *in)

{
  uint32_t uVar1;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  size_t i;
  uint32_t v [16];
  uint32_t m [16];
  ulong local_a0;
  uint local_88 [8];
  uint local_68 [8];
  uint32_t local_48 [4];
  int iStack_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  int iStack_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int iStack_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_48,0xaa,0x40);
  memset(local_88,0xaa,0x40);
  for (local_a0 = 0; local_a0 < 0x10; local_a0 = local_a0 + 1) {
    uVar1 = load32((void *)(in_RSI + local_a0 * 4));
    local_48[local_a0] = uVar1;
  }
  for (local_a0 = 0; local_a0 < 8; local_a0 = local_a0 + 1) {
    local_88[local_a0] = *(uint *)(in_RDI + local_a0 * 4);
  }
  local_68[0] = 0x6a09e667;
  local_68[1] = -0x4498517b;
  local_68[2] = 0x3c6ef372;
  local_68[3] = -0x5ab00ac6;
  local_68[4] = *(uint *)(in_RDI + 0x20) ^ 0x510e527f;
  local_68[5] = *(uint *)(in_RDI + 0x24) ^ 0x9b05688c;
  local_68[6] = *(uint *)(in_RDI + 0x28) ^ 0x1f83d9ab;
  local_68[7] = *(uint *)(in_RDI + 0x2c) ^ 0x5be0cd19;
  local_88[0] = local_88[0] + local_88[4] + local_48[0];
  local_68[4] = rotr32(local_68[4] ^ local_88[0],0x10);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],0xc);
  local_88[0] = local_88[0] + local_88[4] + local_48[1];
  local_68[4] = rotr32(local_68[4] ^ local_88[0],8);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],7);
  local_88[1] = local_88[1] + local_88[5] + local_48[2];
  local_68[5] = rotr32(local_68[5] ^ local_88[1],0x10);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],0xc);
  local_88[1] = local_88[1] + local_88[5] + local_48[3];
  local_68[5] = rotr32(local_68[5] ^ local_88[1],8);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],7);
  local_88[2] = local_88[2] + local_88[6] + iStack_38;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],0x10);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],0xc);
  local_88[2] = local_88[2] + local_88[6] + iStack_34;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],8);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],7);
  local_88[3] = local_88[3] + local_88[7] + iStack_30;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],0x10);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],0xc);
  local_88[3] = local_88[3] + local_88[7] + iStack_2c;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],8);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],7);
  local_88[0] = local_88[0] + local_88[5] + iStack_28;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],0x10);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],0xc);
  local_88[0] = local_88[0] + local_88[5] + iStack_24;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],8);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],7);
  local_88[1] = local_88[1] + local_88[6] + iStack_20;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],0x10);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],0xc);
  local_88[1] = local_88[1] + local_88[6] + iStack_1c;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],8);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],7);
  local_88[2] = local_88[2] + local_88[7] + iStack_18;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],0x10);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],0xc);
  local_88[2] = local_88[2] + local_88[7] + iStack_14;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],8);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],7);
  local_88[3] = local_88[3] + local_88[4] + iStack_10;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],0x10);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],0xc);
  local_88[3] = local_88[3] + local_88[4] + iStack_c;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],8);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],7);
  local_88[0] = local_88[0] + local_88[4] + iStack_10;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],0x10);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],0xc);
  local_88[0] = local_88[0] + local_88[4] + iStack_20;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],8);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],7);
  local_88[1] = local_88[1] + local_88[5] + iStack_38;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],0x10);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],0xc);
  local_88[1] = local_88[1] + local_88[5] + iStack_28;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],8);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],7);
  local_88[2] = local_88[2] + local_88[6] + iStack_24;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],0x10);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],0xc);
  local_88[2] = local_88[2] + local_88[6] + iStack_c;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],8);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],7);
  local_88[3] = local_88[3] + local_88[7] + iStack_14;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],0x10);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],0xc);
  local_88[3] = local_88[3] + local_88[7] + iStack_30;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],8);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],7);
  local_88[0] = local_88[0] + local_88[5] + local_48[1];
  local_68[7] = rotr32(local_68[7] ^ local_88[0],0x10);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],0xc);
  local_88[0] = local_88[0] + local_88[5] + iStack_18;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],8);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],7);
  local_88[1] = local_88[1] + local_88[6] + local_48[0];
  local_68[4] = rotr32(local_68[4] ^ local_88[1],0x10);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],0xc);
  local_88[1] = local_88[1] + local_88[6] + local_48[2];
  local_68[4] = rotr32(local_68[4] ^ local_88[1],8);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],7);
  local_88[2] = local_88[2] + local_88[7] + iStack_1c;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],0x10);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],0xc);
  local_88[2] = local_88[2] + local_88[7] + iStack_2c;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],8);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],7);
  local_88[3] = local_88[3] + local_88[4] + iStack_34;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],0x10);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],0xc);
  local_88[3] = local_88[3] + local_88[4] + local_48[3];
  local_68[6] = rotr32(local_68[6] ^ local_88[3],8);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],7);
  local_88[0] = local_88[0] + local_88[4] + iStack_1c;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],0x10);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],0xc);
  local_88[0] = local_88[0] + local_88[4] + iStack_28;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],8);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],7);
  local_88[1] = local_88[1] + local_88[5] + iStack_18;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],0x10);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],0xc);
  local_88[1] = local_88[1] + local_88[5] + local_48[0];
  local_68[5] = rotr32(local_68[5] ^ local_88[1],8);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],7);
  local_88[2] = local_88[2] + local_88[6] + iStack_34;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],0x10);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],0xc);
  local_88[2] = local_88[2] + local_88[6] + local_48[2];
  local_68[6] = rotr32(local_68[6] ^ local_88[2],8);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],7);
  local_88[3] = local_88[3] + local_88[7] + iStack_c;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],0x10);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],0xc);
  local_88[3] = local_88[3] + local_88[7] + iStack_14;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],8);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],7);
  local_88[0] = local_88[0] + local_88[5] + iStack_20;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],0x10);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],0xc);
  local_88[0] = local_88[0] + local_88[5] + iStack_10;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],8);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],7);
  local_88[1] = local_88[1] + local_88[6] + local_48[3];
  local_68[4] = rotr32(local_68[4] ^ local_88[1],0x10);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],0xc);
  local_88[1] = local_88[1] + local_88[6] + iStack_30;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],8);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],7);
  local_88[2] = local_88[2] + local_88[7] + iStack_2c;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],0x10);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],0xc);
  local_88[2] = local_88[2] + local_88[7] + local_48[1];
  local_68[5] = rotr32(local_68[5] ^ local_88[2],8);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],7);
  local_88[3] = local_88[3] + local_88[4] + iStack_24;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],0x10);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],0xc);
  local_88[3] = local_88[3] + local_88[4] + iStack_38;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],8);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],7);
  local_88[0] = local_88[0] + local_88[4] + iStack_2c;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],0x10);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],0xc);
  local_88[0] = local_88[0] + local_88[4] + iStack_24;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],8);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],7);
  local_88[1] = local_88[1] + local_88[5] + local_48[3];
  local_68[5] = rotr32(local_68[5] ^ local_88[1],0x10);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],0xc);
  local_88[1] = local_88[1] + local_88[5] + local_48[1];
  local_68[5] = rotr32(local_68[5] ^ local_88[1],8);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],7);
  local_88[2] = local_88[2] + local_88[6] + iStack_14;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],0x10);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],0xc);
  local_88[2] = local_88[2] + local_88[6] + iStack_18;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],8);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],7);
  local_88[3] = local_88[3] + local_88[7] + iStack_1c;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],0x10);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],0xc);
  local_88[3] = local_88[3] + local_88[7] + iStack_10;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],8);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],7);
  local_88[0] = local_88[0] + local_88[5] + local_48[2];
  local_68[7] = rotr32(local_68[7] ^ local_88[0],0x10);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],0xc);
  local_88[0] = local_88[0] + local_88[5] + iStack_30;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],8);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],7);
  local_88[1] = local_88[1] + local_88[6] + iStack_34;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],0x10);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],0xc);
  local_88[1] = local_88[1] + local_88[6] + iStack_20;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],8);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],7);
  local_88[2] = local_88[2] + local_88[7] + iStack_38;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],0x10);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],0xc);
  local_88[2] = local_88[2] + local_88[7] + local_48[0];
  local_68[5] = rotr32(local_68[5] ^ local_88[2],8);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],7);
  local_88[3] = local_88[3] + local_88[4] + iStack_c;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],0x10);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],0xc);
  local_88[3] = local_88[3] + local_88[4] + iStack_28;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],8);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],7);
  local_88[0] = local_88[0] + local_88[4] + iStack_24;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],0x10);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],0xc);
  local_88[0] = local_88[0] + local_88[4] + local_48[0];
  local_68[4] = rotr32(local_68[4] ^ local_88[0],8);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],7);
  local_88[1] = local_88[1] + local_88[5] + iStack_34;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],0x10);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],0xc);
  local_88[1] = local_88[1] + local_88[5] + iStack_2c;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],8);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],7);
  local_88[2] = local_88[2] + local_88[6] + local_48[2];
  local_68[6] = rotr32(local_68[6] ^ local_88[2],0x10);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],0xc);
  local_88[2] = local_88[2] + local_88[6] + iStack_38;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],8);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],7);
  local_88[3] = local_88[3] + local_88[7] + iStack_20;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],0x10);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],0xc);
  local_88[3] = local_88[3] + local_88[7] + iStack_c;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],8);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],7);
  local_88[0] = local_88[0] + local_88[5] + iStack_10;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],0x10);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],0xc);
  local_88[0] = local_88[0] + local_88[5] + local_48[1];
  local_68[7] = rotr32(local_68[7] ^ local_88[0],8);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],7);
  local_88[1] = local_88[1] + local_88[6] + iStack_1c;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],0x10);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],0xc);
  local_88[1] = local_88[1] + local_88[6] + iStack_18;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],8);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],7);
  local_88[2] = local_88[2] + local_88[7] + iStack_30;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],0x10);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],0xc);
  local_88[2] = local_88[2] + local_88[7] + iStack_28;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],8);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],7);
  local_88[3] = local_88[3] + local_88[4] + local_48[3];
  local_68[6] = rotr32(local_68[6] ^ local_88[3],0x10);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],0xc);
  local_88[3] = local_88[3] + local_88[4] + iStack_14;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],8);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],7);
  local_88[0] = local_88[0] + local_88[4] + local_48[2];
  local_68[4] = rotr32(local_68[4] ^ local_88[0],0x10);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],0xc);
  local_88[0] = local_88[0] + local_88[4] + iStack_18;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],8);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],7);
  local_88[1] = local_88[1] + local_88[5] + iStack_30;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],0x10);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],0xc);
  local_88[1] = local_88[1] + local_88[5] + iStack_20;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],8);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],7);
  local_88[2] = local_88[2] + local_88[6] + local_48[0];
  local_68[6] = rotr32(local_68[6] ^ local_88[2],0x10);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],0xc);
  local_88[2] = local_88[2] + local_88[6] + iStack_1c;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],8);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],7);
  local_88[3] = local_88[3] + local_88[7] + iStack_28;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],0x10);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],0xc);
  local_88[3] = local_88[3] + local_88[7] + local_48[3];
  local_68[7] = rotr32(local_68[7] ^ local_88[3],8);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],7);
  local_88[0] = local_88[0] + local_88[5] + iStack_38;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],0x10);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],0xc);
  local_88[0] = local_88[0] + local_88[5] + iStack_14;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],8);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],7);
  local_88[1] = local_88[1] + local_88[6] + iStack_2c;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],0x10);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],0xc);
  local_88[1] = local_88[1] + local_88[6] + iStack_34;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],8);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],7);
  local_88[2] = local_88[2] + local_88[7] + iStack_c;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],0x10);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],0xc);
  local_88[2] = local_88[2] + local_88[7] + iStack_10;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],8);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],7);
  local_88[3] = local_88[3] + local_88[4] + local_48[1];
  local_68[6] = rotr32(local_68[6] ^ local_88[3],0x10);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],0xc);
  local_88[3] = local_88[3] + local_88[4] + iStack_24;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],8);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],7);
  local_88[0] = local_88[0] + local_88[4] + iStack_18;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],0x10);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],0xc);
  local_88[0] = local_88[0] + local_88[4] + iStack_34;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],8);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],7);
  local_88[1] = local_88[1] + local_88[5] + local_48[1];
  local_68[5] = rotr32(local_68[5] ^ local_88[1],0x10);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],0xc);
  local_88[1] = local_88[1] + local_88[5] + iStack_c;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],8);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],7);
  local_88[2] = local_88[2] + local_88[6] + iStack_10;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],0x10);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],0xc);
  local_88[2] = local_88[2] + local_88[6] + iStack_14;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],8);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],7);
  local_88[3] = local_88[3] + local_88[7] + iStack_38;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],0x10);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],0xc);
  local_88[3] = local_88[3] + local_88[7] + iStack_20;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],8);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],7);
  local_88[0] = local_88[0] + local_88[5] + local_48[0];
  local_68[7] = rotr32(local_68[7] ^ local_88[0],0x10);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],0xc);
  local_88[0] = local_88[0] + local_88[5] + iStack_2c;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],8);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],7);
  local_88[1] = local_88[1] + local_88[6] + iStack_30;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],0x10);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],0xc);
  local_88[1] = local_88[1] + local_88[6] + local_48[3];
  local_68[4] = rotr32(local_68[4] ^ local_88[1],8);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],7);
  local_88[2] = local_88[2] + local_88[7] + iStack_24;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],0x10);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],0xc);
  local_88[2] = local_88[2] + local_88[7] + local_48[2];
  local_68[5] = rotr32(local_68[5] ^ local_88[2],8);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],7);
  local_88[3] = local_88[3] + local_88[4] + iStack_28;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],0x10);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],0xc);
  local_88[3] = local_88[3] + local_88[4] + iStack_1c;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],8);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],7);
  local_88[0] = local_88[0] + local_88[4] + iStack_14;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],0x10);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],0xc);
  local_88[0] = local_88[0] + local_88[4] + iStack_1c;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],8);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],7);
  local_88[1] = local_88[1] + local_88[5] + iStack_2c;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],0x10);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],0xc);
  local_88[1] = local_88[1] + local_88[5] + iStack_10;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],8);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],7);
  local_88[2] = local_88[2] + local_88[6] + iStack_18;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],0x10);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],0xc);
  local_88[2] = local_88[2] + local_88[6] + local_48[1];
  local_68[6] = rotr32(local_68[6] ^ local_88[2],8);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],7);
  local_88[3] = local_88[3] + local_88[7] + local_48[3];
  local_68[7] = rotr32(local_68[7] ^ local_88[3],0x10);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],0xc);
  local_88[3] = local_88[3] + local_88[7] + iStack_24;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],8);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],7);
  local_88[0] = local_88[0] + local_88[5] + iStack_34;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],0x10);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],0xc);
  local_88[0] = local_88[0] + local_88[5] + local_48[0];
  local_68[7] = rotr32(local_68[7] ^ local_88[0],8);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],7);
  local_88[1] = local_88[1] + local_88[6] + iStack_c;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],0x10);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],0xc);
  local_88[1] = local_88[1] + local_88[6] + iStack_38;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],8);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],7);
  local_88[2] = local_88[2] + local_88[7] + iStack_28;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],0x10);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],0xc);
  local_88[2] = local_88[2] + local_88[7] + iStack_30;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],8);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],7);
  local_88[3] = local_88[3] + local_88[4] + local_48[2];
  local_68[6] = rotr32(local_68[6] ^ local_88[3],0x10);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],0xc);
  local_88[3] = local_88[3] + local_88[4] + iStack_20;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],8);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],7);
  local_88[0] = local_88[0] + local_88[4] + iStack_30;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],0x10);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],0xc);
  local_88[0] = local_88[0] + local_88[4] + iStack_c;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],8);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],7);
  local_88[1] = local_88[1] + local_88[5] + iStack_10;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],0x10);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],0xc);
  local_88[1] = local_88[1] + local_88[5] + iStack_24;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],8);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],7);
  local_88[2] = local_88[2] + local_88[6] + iStack_1c;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],0x10);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],0xc);
  local_88[2] = local_88[2] + local_88[6] + local_48[3];
  local_68[6] = rotr32(local_68[6] ^ local_88[2],8);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],7);
  local_88[3] = local_88[3] + local_88[7] + local_48[0];
  local_68[7] = rotr32(local_68[7] ^ local_88[3],0x10);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],0xc);
  local_88[3] = local_88[3] + local_88[7] + iStack_28;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],8);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],7);
  local_88[0] = local_88[0] + local_88[5] + iStack_18;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],0x10);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],0xc);
  local_88[0] = local_88[0] + local_88[5] + local_48[2];
  local_68[7] = rotr32(local_68[7] ^ local_88[0],8);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],7);
  local_88[1] = local_88[1] + local_88[6] + iStack_14;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],0x10);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],0xc);
  local_88[1] = local_88[1] + local_88[6] + iStack_2c;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],8);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],7);
  local_88[2] = local_88[2] + local_88[7] + local_48[1];
  local_68[5] = rotr32(local_68[5] ^ local_88[2],0x10);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],0xc);
  local_88[2] = local_88[2] + local_88[7] + iStack_38;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],8);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],7);
  local_88[3] = local_88[3] + local_88[4] + iStack_20;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],0x10);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],0xc);
  local_88[3] = local_88[3] + local_88[4] + iStack_34;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],8);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],7);
  local_88[0] = local_88[0] + local_88[4] + iStack_20;
  local_68[4] = rotr32(local_68[4] ^ local_88[0],0x10);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],0xc);
  local_88[0] = local_88[0] + local_88[4] + local_48[2];
  local_68[4] = rotr32(local_68[4] ^ local_88[0],8);
  local_68[0] = local_68[0] + local_68[4];
  local_88[4] = rotr32(local_88[4] ^ local_68[0],7);
  local_88[1] = local_88[1] + local_88[5] + iStack_28;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],0x10);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],0xc);
  local_88[1] = local_88[1] + local_88[5] + iStack_38;
  local_68[5] = rotr32(local_68[5] ^ local_88[1],8);
  local_68[1] = local_68[1] + local_68[5];
  local_88[5] = rotr32(local_88[5] ^ local_68[1],7);
  local_88[2] = local_88[2] + local_88[6] + iStack_2c;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],0x10);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],0xc);
  local_88[2] = local_88[2] + local_88[6] + iStack_30;
  local_68[6] = rotr32(local_68[6] ^ local_88[2],8);
  local_68[2] = local_68[2] + local_68[6];
  local_88[6] = rotr32(local_88[6] ^ local_68[2],7);
  local_88[3] = local_88[3] + local_88[7] + local_48[1];
  local_68[7] = rotr32(local_68[7] ^ local_88[3],0x10);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],0xc);
  local_88[3] = local_88[3] + local_88[7] + iStack_34;
  local_68[7] = rotr32(local_68[7] ^ local_88[3],8);
  local_68[3] = local_68[3] + local_68[7];
  local_88[7] = rotr32(local_88[7] ^ local_68[3],7);
  local_88[0] = local_88[0] + local_88[5] + iStack_c;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],0x10);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],0xc);
  local_88[0] = local_88[0] + local_88[5] + iStack_1c;
  local_68[7] = rotr32(local_68[7] ^ local_88[0],8);
  local_68[2] = local_68[2] + local_68[7];
  local_88[5] = rotr32(local_88[5] ^ local_68[2],7);
  local_88[1] = local_88[1] + local_88[6] + iStack_24;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],0x10);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],0xc);
  local_88[1] = local_88[1] + local_88[6] + iStack_10;
  local_68[4] = rotr32(local_68[4] ^ local_88[1],8);
  local_68[3] = local_68[3] + local_68[4];
  local_88[6] = rotr32(local_88[6] ^ local_68[3],7);
  local_88[2] = local_88[2] + local_88[7] + local_48[3];
  local_68[5] = rotr32(local_68[5] ^ local_88[2],0x10);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],0xc);
  local_88[2] = local_88[2] + local_88[7] + iStack_18;
  local_68[5] = rotr32(local_68[5] ^ local_88[2],8);
  local_68[0] = local_68[0] + local_68[5];
  local_88[7] = rotr32(local_88[7] ^ local_68[0],7);
  local_88[3] = local_88[3] + local_88[4] + iStack_14;
  local_68[6] = rotr32(local_68[6] ^ local_88[3],0x10);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],0xc);
  local_88[3] = local_88[3] + local_88[4] + local_48[0];
  local_68[6] = rotr32(local_68[6] ^ local_88[3],8);
  local_68[1] = local_68[1] + local_68[6];
  local_88[4] = rotr32(local_88[4] ^ local_68[1],7);
  for (local_a0 = 0; local_a0 < 8; local_a0 = local_a0 + 1) {
    *(uint *)(in_RDI + local_a0 * 4) =
         *(uint *)(in_RDI + local_a0 * 4) ^ local_88[local_a0] ^ local_68[local_a0];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blake2s_compress( blake2s_state *S, const uint8_t in[BLAKE2S_BLOCKBYTES] )
{
  uint32_t m[16];
  uint32_t v[16];
  size_t i;

  for( i = 0; i < 16; ++i ) {
    m[i] = load32( in + i * sizeof( m[i] ) );
  }

  for( i = 0; i < 8; ++i ) {
    v[i] = S->h[i];
  }

  v[ 8] = blake2s_IV[0];
  v[ 9] = blake2s_IV[1];
  v[10] = blake2s_IV[2];
  v[11] = blake2s_IV[3];
  v[12] = S->t[0] ^ blake2s_IV[4];
  v[13] = S->t[1] ^ blake2s_IV[5];
  v[14] = S->f[0] ^ blake2s_IV[6];
  v[15] = S->f[1] ^ blake2s_IV[7];

  ROUND( 0 );
  ROUND( 1 );
  ROUND( 2 );
  ROUND( 3 );
  ROUND( 4 );
  ROUND( 5 );
  ROUND( 6 );
  ROUND( 7 );
  ROUND( 8 );
  ROUND( 9 );

  for( i = 0; i < 8; ++i ) {
    S->h[i] = S->h[i] ^ v[i] ^ v[i + 8];
  }
}